

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall CTcPrsMem::reset(CTcPrsMem *this)

{
  tcprsmem_blk_t *ptVar1;
  tcprsmem_blk_t *__ptr;
  
  __ptr = this->head_;
  while (__ptr != (tcprsmem_blk_t *)0x0) {
    ptVar1 = __ptr->next_;
    free(__ptr);
    this->head_ = ptVar1;
    __ptr = ptVar1;
  }
  this->tail_ = (tcprsmem_blk_t *)0x0;
  alloc_block(this);
  G_objfixup = (CTcIdFixup *)0x0;
  G_propfixup = (CTcIdFixup *)0x0;
  G_enumfixup = (CTcIdFixup *)0x0;
  return;
}

Assistant:

void CTcPrsMem::reset()
{
    /* delete all blocks */
    delete_all();

    /* re-allocate the initial block */
    alloc_block();

    /* fixups are allocated in parser memory, so they're gone now */
    G_objfixup = 0;
    G_propfixup = 0;
    G_enumfixup = 0;
}